

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O2

bool __thiscall
tlx::CmdlineParser::ArgumentString::process(ArgumentString *this,int *argc,char ***argv)

{
  int iVar1;
  
  iVar1 = *argc;
  if (iVar1 != 0) {
    std::__cxx11::string::assign((char *)this->dest_);
    *argc = *argc + -1;
    *argv = *argv + 1;
  }
  return iVar1 != 0;
}

Assistant:

bool process(int& argc, const char* const*& argv) final { // NOLINT
        if (argc == 0)
            return false;
        dest_ = argv[0];
        --argc, ++argv;
        return true;
    }